

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

QStringList * __thiscall
QUrlQuery::allQueryItemValues
          (QStringList *__return_storage_ptr__,QUrlQuery *this,QString *key,
          ComponentFormattingOptions encoding)

{
  uint uVar1;
  int iVar2;
  qsizetype qVar3;
  long lVar4;
  QUrlQueryPrivate *pQVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QStringView in;
  QString local_78;
  undefined1 local_58 [16];
  qsizetype local_48;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar5 = (this->d).d.ptr;
  if (pQVar5 != (QUrlQueryPrivate *)0x0) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [16])0x0;
    local_48 = 0;
    uVar1._0_2_ = pQVar5->valueDelimiter;
    uVar1._2_2_ = pQVar5->pairDelimiter;
    auVar6 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0xe1);
    local_40 = auVar6._0_4_;
    local_3c = 0x23;
    in.m_data = (key->d).ptr;
    in.m_size = (key->d).size;
    qVar3 = qt_urlRecode((QString *)local_58,in,(ComponentFormattingOptions)0x2000000,
                         (ushort *)&local_40);
    local_78.d.size = local_48;
    if (qVar3 == 0) {
      local_78.d.d = (key->d).d;
      local_78.d.ptr = (key->d).ptr;
      local_78.d.size = (key->d).size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_78.d.d = (Data *)local_58._0_8_;
      local_78.d.ptr = (char16_t *)local_58._8_8_;
      local_58 = ZEXT816(0);
      local_48 = 0;
    }
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    iVar2 = QUrlQueryPrivate::findRecodedKey((this->d).d.ptr,&local_78,0);
    lVar4 = (long)iVar2;
    pQVar5 = (this->d).d.ptr;
    if (lVar4 < (pQVar5->itemList).d.size) {
      do {
        QUrlQueryPrivate::recodeToUser
                  ((QString *)local_58,pQVar5,&(pQVar5->itemList).d.ptr[lVar4].second,encoding);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,(QString *)local_58);
        QList<QString>::end(__return_storage_ptr__);
        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
          }
        }
        iVar2 = QUrlQueryPrivate::findRecodedKey((this->d).d.ptr,&local_78,iVar2 + 1);
        lVar4 = (long)iVar2;
        pQVar5 = (this->d).d.ptr;
      } while (lVar4 < (pQVar5->itemList).d.size);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QUrlQuery::allQueryItemValues(const QString &key, QUrl::ComponentFormattingOptions encoding) const
{
    QStringList result;
    if (d) {
        QString encodedKey = d->recodeFromUser(key);
        int idx = d->findRecodedKey(encodedKey);
        while (idx < d->itemList.size()) {
            result << d->recodeToUser(d->itemList.at(idx).second, encoding);
            idx = d->findRecodedKey(encodedKey, idx + 1);
        }
    }
    return result;
}